

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
kj::ArrayBuilder<capnp::Orphan<capnp::compiler::Declaration>_>::dispose
          (ArrayBuilder<capnp::Orphan<capnp::compiler::Declaration>_> *this)

{
  Orphan<capnp::compiler::Declaration> *firstElement;
  RemoveConst<capnp::Orphan<capnp::compiler::Declaration>_> *pRVar1;
  Orphan<capnp::compiler::Declaration> *pOVar2;
  Orphan<capnp::compiler::Declaration> *endCopy;
  Orphan<capnp::compiler::Declaration> *posCopy;
  Orphan<capnp::compiler::Declaration> *ptrCopy;
  ArrayBuilder<capnp::Orphan<capnp::compiler::Declaration>_> *this_local;
  
  firstElement = this->ptr;
  pRVar1 = this->pos;
  pOVar2 = this->endPtr;
  if (firstElement != (Orphan<capnp::compiler::Declaration> *)0x0) {
    this->ptr = (Orphan<capnp::compiler::Declaration> *)0x0;
    this->pos = (RemoveConst<capnp::Orphan<capnp::compiler::Declaration>_> *)0x0;
    this->endPtr = (Orphan<capnp::compiler::Declaration> *)0x0;
    ArrayDisposer::dispose<capnp::Orphan<capnp::compiler::Declaration>>
              (this->disposer,firstElement,(long)pRVar1 - (long)firstElement >> 5,
               (long)pOVar2 - (long)firstElement >> 5);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }